

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O0

REF_STATUS ref_oct_unique_nodes(REF_OCT ref_oct,REF_NODE ref_node)

{
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_NODE ref_node_local;
  REF_OCT ref_oct_local;
  
  if ((long)ref_oct->nnode == 0) {
    if ((long)ref_node->n == 0) {
      ref_oct_local._4_4_ = ref_oct_unique_corner_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
      if (ref_oct_local._4_4_ == 0) {
        ref_oct_local._4_4_ = ref_oct_unique_face_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
        if (ref_oct_local._4_4_ == 0) {
          ref_oct_local._4_4_ = ref_oct_unique_center_nodes_node(ref_oct,0,ref_oct->bbox,ref_node);
          if (ref_oct_local._4_4_ == 0) {
            ref_oct_local._4_4_ = ref_node_initialize_n_global(ref_node,(long)ref_oct->nnode);
            if (ref_oct_local._4_4_ == 0) {
              ref_oct_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c"
                     ,0x19b,"ref_oct_unique_nodes",(ulong)ref_oct_local._4_4_,"init glob");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                   0x199,"ref_oct_unique_nodes",(ulong)ref_oct_local._4_4_,"center node descend");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0x197,"ref_oct_unique_nodes",(ulong)ref_oct_local._4_4_,"face node descend");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x195
               ,"ref_oct_unique_nodes",(ulong)ref_oct_local._4_4_,"corner node descend");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x193,
             "ref_oct_unique_nodes","expected zero grid nodes",0,(long)ref_node->n);
      ref_oct_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x192,
           "ref_oct_unique_nodes","expected zero oct nodes",0,(long)ref_oct->nnode);
    ref_oct_local._4_4_ = 1;
  }
  return ref_oct_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_oct_unique_nodes(REF_OCT ref_oct, REF_NODE ref_node) {
  REIS(0, ref_oct_nnode(ref_oct), "expected zero oct nodes");
  REIS(0, ref_node_n(ref_node), "expected zero grid nodes");
  RSS(ref_oct_unique_corner_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "corner node descend");
  RSS(ref_oct_unique_face_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "face node descend");
  RSS(ref_oct_unique_center_nodes_node(ref_oct, 0, ref_oct->bbox, ref_node),
      "center node descend");
  RSS(ref_node_initialize_n_global(ref_node, ref_oct_nnode(ref_oct)),
      "init glob");
  return REF_SUCCESS;
}